

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O3

pint p_test_case_psocket_udp_test(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 local_28;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  is_sender_working = 1;
  is_receiver_working = 1;
  local_28 = 0;
  lVar3 = p_uthread_create(udp_socket_receiver_thread,&local_28,1,0);
  lVar4 = p_uthread_create(udp_socket_sender_thread,&local_28,1,0);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3ee);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (lVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3ef);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_uthread_sleep(8000);
  is_sender_working = 0;
  iVar1 = p_uthread_join(lVar4);
  p_uthread_sleep(2000);
  is_receiver_working = 0;
  iVar2 = p_uthread_join(lVar3);
  if (iVar1 < 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3fb);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (iVar2 < 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3fc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_uthread_unref(lVar4);
  p_uthread_unref(lVar3);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (psocket_udp_test)
{
	p_libsys_init ();

	is_sender_working   = TRUE;
	is_receiver_working = TRUE;

	SocketTestData data;
	data.receiver_port    = 0;
	data.sender_port      = 0;
	data.shutdown_channel = FALSE;

	PUThread *receiver_thr = p_uthread_create ((PUThreadFunc) udp_socket_receiver_thread,
						   (ppointer) &data,
						   TRUE,
						   NULL);

	PUThread *sender_thr = p_uthread_create ((PUThreadFunc) udp_socket_sender_thread,
						 (ppointer) &data,
						 TRUE,
						 NULL);

	P_TEST_CHECK (sender_thr != NULL);
	P_TEST_CHECK (receiver_thr != NULL);

	p_uthread_sleep (8000);

	is_sender_working = FALSE;
	pint send_counter = p_uthread_join (sender_thr);

	p_uthread_sleep (2000);

	is_receiver_working = FALSE;
	pint recv_counter = p_uthread_join (receiver_thr);

	P_TEST_CHECK (send_counter > 0);
	P_TEST_CHECK (recv_counter > 0);

	p_uthread_unref (sender_thr);
	p_uthread_unref (receiver_thr);

	p_libsys_shutdown ();
}